

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O2

void node::ReadNotificationArgs(ArgsManager *args,KernelNotifications *notifications)

{
  long in_FS_OFFSET;
  optional<long> oVar1;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-stopatheight",&local_49);
  oVar1 = ArgsManager::GetIntArg(args,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((undefined1  [16])
       oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    notifications->m_stop_at_height =
         oVar1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload._0_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReadNotificationArgs(const ArgsManager& args, KernelNotifications& notifications)
{
    if (auto value{args.GetIntArg("-stopatheight")}) notifications.m_stop_at_height = *value;
}